

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O1

void __thiscall ViewTest::coordinatesToIndexTest<true>(ViewTest *this)

{
  unsigned_long uVar1;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var2;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var3;
  logic_error *plVar4;
  value_type *__val;
  size_t sVar5;
  value_type *__val_2;
  value_type *__val_1;
  size_t index;
  View<int,_true,_std::allocator<unsigned_long>_> v;
  allocator_type local_81;
  size_t local_80;
  CoordinateOrder local_74;
  undefined1 local_70 [16];
  size_t *local_60;
  size_t local_48;
  
  _Var2._M_current = (unsigned_long *)operator_new(0x18);
  *_Var2._M_current = 0;
  _Var2._M_current[1] = 0;
  *_Var2._M_current = 3;
  _Var2._M_current[1] = 2;
  _Var2._M_current[2] = 4;
  local_80 = CONCAT44(local_80._4_4_,1);
  local_74 = LastMajorOrder;
  local_70._0_8_ = this->data_;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_70 + 8),_Var2,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var2._M_current + 3),(CoordinateOrder *)&local_80,&local_74,&local_81);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_70);
  _Var3._M_current = (unsigned_long *)operator_new(0x18);
  *_Var3._M_current = 0;
  _Var3._M_current[1] = 0;
  _Var3._M_current[2] = 0;
  if (_Var2._M_current[2] != 0) {
    sVar5 = 0;
    do {
      _Var3._M_current[1] = 0;
      if (_Var2._M_current[1] != 0) {
        do {
          *_Var3._M_current = 0;
          if (*_Var2._M_current != 0) {
            do {
              local_80 = 100;
              andres::View<int,true,std::allocator<unsigned_long>>::
              coordinatesToIndex<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                        ((View<int,true,std::allocator<unsigned_long>> *)local_70,_Var3,&local_80);
              if (sVar5 != local_80) {
                plVar4 = (logic_error *)__cxa_allocate_exception(0x10);
                std::logic_error::logic_error(plVar4,"test failed.");
                __cxa_throw(plVar4,&std::logic_error::typeinfo,std::logic_error::~logic_error);
              }
              sVar5 = sVar5 + 1;
              uVar1 = *_Var3._M_current;
              *_Var3._M_current = uVar1 + 1;
            } while (uVar1 + 1 < *_Var2._M_current);
          }
          uVar1 = _Var3._M_current[1];
          _Var3._M_current[1] = uVar1 + 1;
        } while (uVar1 + 1 < _Var2._M_current[1]);
      }
      uVar1 = _Var3._M_current[2];
      _Var3._M_current[2] = uVar1 + 1;
    } while (uVar1 + 1 < _Var2._M_current[2]);
  }
  operator_delete(_Var3._M_current,0x18);
  operator_delete(local_60,local_48 * 0x18);
  operator_delete(_Var2._M_current,0x18);
  _Var2._M_current = (unsigned_long *)operator_new(0x18);
  *_Var2._M_current = 0;
  _Var2._M_current[1] = 0;
  *_Var2._M_current = 3;
  _Var2._M_current[1] = 2;
  _Var2._M_current[2] = 4;
  local_80 = CONCAT44(local_80._4_4_,1);
  local_74 = FirstMajorOrder;
  local_70._0_8_ = this->data_;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_70 + 8),_Var2,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var2._M_current + 3),(CoordinateOrder *)&local_80,&local_74,&local_81);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_70);
  _Var3._M_current = (unsigned_long *)operator_new(0x18);
  *_Var3._M_current = 0;
  _Var3._M_current[1] = 0;
  _Var3._M_current[2] = 0;
  if (*_Var2._M_current != 0) {
    sVar5 = 0;
    do {
      _Var3._M_current[1] = 0;
      if (_Var2._M_current[1] != 0) {
        do {
          _Var3._M_current[2] = 0;
          if (_Var2._M_current[2] != 0) {
            do {
              local_80 = 100;
              andres::View<int,true,std::allocator<unsigned_long>>::
              coordinatesToIndex<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                        ((View<int,true,std::allocator<unsigned_long>> *)local_70,_Var3,&local_80);
              if (sVar5 != local_80) {
                plVar4 = (logic_error *)__cxa_allocate_exception(0x10);
                std::logic_error::logic_error(plVar4,"test failed.");
                __cxa_throw(plVar4,&std::logic_error::typeinfo,std::logic_error::~logic_error);
              }
              sVar5 = sVar5 + 1;
              uVar1 = _Var3._M_current[2];
              _Var3._M_current[2] = uVar1 + 1;
            } while (uVar1 + 1 < _Var2._M_current[2]);
          }
          uVar1 = _Var3._M_current[1];
          _Var3._M_current[1] = uVar1 + 1;
        } while (uVar1 + 1 < _Var2._M_current[1]);
      }
      uVar1 = *_Var3._M_current;
      *_Var3._M_current = uVar1 + 1;
    } while (uVar1 + 1 < *_Var2._M_current);
  }
  operator_delete(_Var3._M_current,0x18);
  operator_delete(local_60,local_48 * 0x18);
  operator_delete(_Var2._M_current,0x18);
  return;
}

Assistant:

void ViewTest::coordinatesToIndexTest() {
    // internalFirstMajorOrder == false
    {
        std::vector<std::size_t> shape(3);
        shape[0] = 3;
        shape[1] = 2;
        shape[2] = 4;
        andres::View<int, constTarget> v(shape.begin(), shape.end(),
            data_, andres::LastMajorOrder, andres::LastMajorOrder);

        std::vector<std::size_t> c(3);
        std::size_t trueIndex = 0;
        for(c[2]=0; c[2]<shape[2]; ++c[2]) 
        for(c[1]=0; c[1]<shape[1]; ++c[1])
        for(c[0]=0; c[0]<shape[0]; ++c[0]) {
            std::size_t index = 100;
            v.coordinatesToIndex(c.begin(), index);
            test(index == trueIndex);
            ++trueIndex;
        }
    }
    // internalFirstMajorOrder == true
    {
        std::vector<std::size_t> shape(3);
        shape[0] = 3;
        shape[1] = 2;
        shape[2] = 4;
        andres::View<int, constTarget> v(shape.begin(), shape.end(),
            data_, andres::LastMajorOrder, andres::FirstMajorOrder);

        std::vector<std::size_t> c(3);
        std::size_t trueIndex = 0;
        for(c[0]=0; c[0]<shape[0]; ++c[0]) 
        for(c[1]=0; c[1]<shape[1]; ++c[1])
        for(c[2]=0; c[2]<shape[2]; ++c[2]) {
            std::size_t index = 100;
            v.coordinatesToIndex(c.begin(), index);
            test(index == trueIndex);
            ++trueIndex;
        }
    }
}